

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O3

int cvLsDQJtimes(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector y,N_Vector fy,void *cvode_mem,
                N_Vector work)

{
  int iVar1;
  int iVar2;
  double dVar3;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_40;
  CVodeMem local_38;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"cvLsDQJtimes",&local_38,&local_40);
  if (iVar1 == 0) {
    dVar3 = (double)N_VWrmsNorm(v,local_38->cv_ewt);
    dVar3 = 1.0 / dVar3;
    iVar1 = 3;
    do {
      N_VLinearSum(dVar3,0x3ff0000000000000,v,y,work);
      iVar2 = (*local_40->jt_f)(t,work,Jv,local_38->cv_user_data);
      local_40->nfeDQ = local_40->nfeDQ + 1;
      if (iVar2 == 0) {
        N_VLinearSum(1.0 / dVar3,-(1.0 / dVar3),Jv,fy,Jv);
        return 0;
      }
      if (iVar2 < 0) {
        return -1;
      }
      dVar3 = dVar3 * 0.25;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int cvLsDQJtimes(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector y,
                 N_Vector fy, void* cvode_mem, N_Vector work)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  sunrealtype sig, siginv;
  int iter, retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Initialize perturbation to 1/||v|| */
  sig = ONE / N_VWrmsNorm(v, cv_mem->cv_ewt);

  for (iter = 0; iter < MAX_DQITERS; iter++)
  {
    /* Set work = y + sig*v */
    N_VLinearSum(sig, v, ONE, y, work);

    /* Set Jv = f(tn, y+sig*v) */
    retval = cvls_mem->jt_f(t, work, Jv, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval == 0) { break; }
    if (retval < 0) { return (-1); }

    /* If f failed recoverably, shrink sig and retry */
    sig *= PT25;
  }

  /* If retval still isn't 0, return with a recoverable failure */
  if (retval > 0) { return (+1); }

  /* Replace Jv by (Jv - fy)/sig */
  siginv = ONE / sig;
  N_VLinearSum(siginv, Jv, -siginv, fy, Jv);

  return (0);
}